

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O2

Promise<void> __thiscall
capnp::_::TestInterfaceImpl::getTestMoreStuff
          (TestInterfaceImpl *this,GetTestMoreStuffContext context)

{
  Fault FStack_88;
  Own<capnp::_::TestMoreStuffImpl,_std::nullptr_t> local_80;
  undefined1 local_70 [24];
  CallContext<capnproto_test::capnp::test::TestInterface::GetTestMoreStuffParams,_capnproto_test::capnp::test::TestInterface::GetTestMoreStuffResults>
  local_58;
  Builder local_50;
  Maybe<capnp::MessageSize> local_28;
  
  local_28.ptr.isSet = false;
  CallContext<capnproto_test::capnp::test::TestInterface::GetTestMoreStuffParams,_capnproto_test::capnp::test::TestInterface::GetTestMoreStuffResults>
  ::getResults(&local_50,&local_58,&local_28);
  if (context.hook[2]._vptr_CallContextHook != (_func_int **)0x0) {
    kj::heap<capnp::_::TestMoreStuffImpl,int&,int&>
              ((kj *)&local_80,(int *)context.hook[1]._vptr_CallContextHook,
               (int *)context.hook[2]._vptr_CallContextHook);
    capnproto_test::capnp::test::TestMoreStuff::Client::Client<capnp::_::TestMoreStuffImpl,void>
              ((Client *)local_70,&local_80);
    capnproto_test::capnp::test::TestInterface::GetTestMoreStuffResults::Builder::setCap
              (&local_50,(Client *)local_70);
    kj::Own<capnp::ClientHook,_std::nullptr_t>::dispose
              ((Own<capnp::ClientHook,_std::nullptr_t> *)(local_70 + 8));
    kj::Own<capnp::_::TestMoreStuffImpl,_std::nullptr_t>::dispose(&local_80);
    kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
    return (PromiseBase)(PromiseBase)this;
  }
  kj::_::Debug::Fault::Fault
            (&FStack_88,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++"
             ,0x3a5,FAILED,"handleCount != nullptr","");
  kj::_::Debug::Fault::fatal(&FStack_88);
}

Assistant:

kj::Promise<void> TestInterfaceImpl::getTestMoreStuff(GetTestMoreStuffContext context) {
  context.getResults().setCap(
      kj::heap<TestMoreStuffImpl>(callCount, KJ_REQUIRE_NONNULL(handleCount)));
  return kj::READY_NOW;
}